

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walIndexAppend(Wal *pWal,u32 iFrame,u32 iPage)

{
  int iVar1;
  int local_4c;
  int nByte;
  int nCollide;
  int idx;
  int iKey;
  WalHashLoc sLoc;
  int rc;
  u32 iPage_local;
  u32 iFrame_local;
  Wal *pWal_local;
  
  iVar1 = walFramePage(iFrame);
  sLoc._20_4_ = walHashGet(pWal,iVar1,(WalHashLoc *)&idx);
  if (sLoc._20_4_ == 0) {
    iVar1 = iFrame - (int)sLoc.aPgno;
    if (iVar1 == 1) {
      memset(sLoc.aHash,0,(long)(((int)_idx + 0x4000) - (int)sLoc.aHash));
    }
    if (*(int *)(sLoc.aHash + (long)(iVar1 + -1) * 2) != 0) {
      walCleanupHash(pWal);
    }
    nCollide = walHash(iPage);
    local_4c = iVar1;
    while (_idx[nCollide] != 0) {
      if (local_4c == 0) {
        iVar1 = sqlite3CorruptError(0xf565);
        return iVar1;
      }
      nCollide = walNextHash(nCollide);
      local_4c = local_4c + -1;
    }
    *(u32 *)(sLoc.aHash + (long)(iVar1 + -1) * 2) = iPage;
    nByte._0_2_ = (ht_slot)iVar1;
    _idx[nCollide] = (ht_slot)nByte;
  }
  return sLoc._20_4_;
}

Assistant:

static int walIndexAppend(Wal *pWal, u32 iFrame, u32 iPage){
  int rc;                         /* Return code */
  WalHashLoc sLoc;                /* Wal-index hash table location */

  rc = walHashGet(pWal, walFramePage(iFrame), &sLoc);

  /* Assuming the wal-index file was successfully mapped, populate the
  ** page number array and hash table entry.
  */
  if( rc==SQLITE_OK ){
    int iKey;                     /* Hash table key */
    int idx;                      /* Value to write to hash-table slot */
    int nCollide;                 /* Number of hash collisions */

    idx = iFrame - sLoc.iZero;
    assert( idx <= HASHTABLE_NSLOT/2 + 1 );

    /* If this is the first entry to be added to this hash-table, zero the
    ** entire hash table and aPgno[] array before proceeding.
    */
    if( idx==1 ){
      int nByte = (int)((u8*)&sLoc.aHash[HASHTABLE_NSLOT] - (u8*)sLoc.aPgno);
      assert( nByte>=0 );
      memset((void*)sLoc.aPgno, 0, nByte);
    }

    /* If the entry in aPgno[] is already set, then the previous writer
    ** must have exited unexpectedly in the middle of a transaction (after
    ** writing one or more dirty pages to the WAL to free up memory).
    ** Remove the remnants of that writers uncommitted transaction from
    ** the hash-table before writing any new entries.
    */
    if( sLoc.aPgno[idx-1] ){
      walCleanupHash(pWal);
      assert( !sLoc.aPgno[idx-1] );
    }

    /* Write the aPgno[] array entry and the hash-table slot. */
    nCollide = idx;
    for(iKey=walHash(iPage); sLoc.aHash[iKey]; iKey=walNextHash(iKey)){
      if( (nCollide--)==0 ) return SQLITE_CORRUPT_BKPT;
    }
    sLoc.aPgno[idx-1] = iPage;
    AtomicStore(&sLoc.aHash[iKey], (ht_slot)idx);

#ifdef SQLITE_ENABLE_EXPENSIVE_ASSERT
    /* Verify that the number of entries in the hash table exactly equals
    ** the number of entries in the mapping region.
    */
    {
      int i;           /* Loop counter */
      int nEntry = 0;  /* Number of entries in the hash table */
      for(i=0; i<HASHTABLE_NSLOT; i++){ if( sLoc.aHash[i] ) nEntry++; }
      assert( nEntry==idx );
    }

    /* Verify that the every entry in the mapping region is reachable
    ** via the hash table.  This turns out to be a really, really expensive
    ** thing to check, so only do this occasionally - not on every
    ** iteration.
    */
    if( (idx&0x3ff)==0 ){
      int i;           /* Loop counter */
      for(i=0; i<idx; i++){
        for(iKey=walHash(sLoc.aPgno[i]);
            sLoc.aHash[iKey];
            iKey=walNextHash(iKey)){
          if( sLoc.aHash[iKey]==i+1 ) break;
        }
        assert( sLoc.aHash[iKey]==i+1 );
      }
    }
#endif /* SQLITE_ENABLE_EXPENSIVE_ASSERT */
  }

  return rc;
}